

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_cbc_hmac_sha256_hw.c
# Opt level: O0

int aesni_cbc_hmac_sha256_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  void *__s;
  long lVar9;
  ulong in_RCX;
  long in_RDX;
  uint uVar10;
  long in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  uint cmask;
  uint c_1;
  size_t off;
  uchar *p;
  u32 ret__8;
  u32 ret__7;
  u32 ret__6;
  u32 ret__5;
  u32 ret__4;
  u32 ret__3;
  u32 ret__2;
  u32 ret__1;
  size_t c;
  u32 ret_;
  anon_union_64_2_94730053 *data;
  int ret;
  uint bitlen;
  uint pad;
  uint maxpad;
  uint res;
  size_t i;
  size_t j;
  size_t mask;
  size_t inp_len;
  anon_union_96_2_94730053 *pmac;
  anon_union_96_2_94730053 mac;
  size_t blocks;
  size_t aes_off;
  size_t sha_off;
  size_t iv;
  size_t plen;
  uint l;
  EVP_AES_HMAC_SHA256 *key;
  undefined8 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  void *in_stack_fffffffffffffe98;
  SHA256_CTX *in_stack_fffffffffffffea0;
  uint local_ec;
  ulong local_e8;
  ulong local_e0;
  long local_d0;
  uint local_c0 [24];
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  int local_34;
  void *local_30;
  ulong local_28;
  long local_20;
  long local_18;
  EVP_CIPHER_CTX *local_10;
  int local_4;
  
  uVar6 = (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  local_40 = *(ulong *)((long)local_30 + 0x248);
  local_48 = 0;
  local_58 = 0;
  local_50 = (ulong)(0x40 - *(int *)((long)local_30 + 0x23c));
  *(undefined8 *)((long)local_30 + 0x248) = 0xffffffffffffffff;
  if ((local_28 & 0xf) == 0) {
    iVar3 = EVP_CIPHER_CTX_is_encrypting(local_10);
    if (iVar3 == 0) {
      aesni_cbc_encrypt(local_20,local_18,local_28,local_30,local_10->iv,0);
      pvVar2 = local_30;
      if (local_40 != 0xffffffffffffffff) {
        __s = (void *)((long)local_30 + 0x1fc);
        if (0x301 < CONCAT11(*(undefined1 *)((long)local_30 + local_40 + 0x24c),
                             *(undefined1 *)((long)local_30 + local_40 + 0x24d))) {
          local_48 = 0x10;
        }
        if (local_28 < local_48 + 0x21U) {
          return 0;
        }
        local_18 = local_48 + local_18;
        local_28 = local_28 - local_48;
        uVar4 = (int)local_28 - 0x21;
        uVar4 = 0xff - uVar4 >> 0x18 | uVar4 & 0xff;
        uVar5 = constant_time_ge(0,0x4212ba);
        uVar6 = constant_time_select(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,uVar6);
        local_d0 = local_28 - (uVar6 + 0x21);
        *(char *)((long)local_30 + local_40 + 0x24e) = (char)((ulong)local_d0 >> 8);
        *(char *)((long)local_30 + local_40 + 0x24f) = (char)local_d0;
        memcpy((void *)((long)local_30 + 0x1d4),(void *)((long)local_30 + 0xf4),0x70);
        sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        uVar8 = local_28 - 0x20;
        if (0x13f < uVar8) {
          lVar9 = (ulong)(0x40 - *(int *)((long)local_30 + 0x23c)) +
                  (local_28 - 0x160 & 0xffffffffffffffc0);
          local_28 = uVar8;
          sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          local_18 = lVar9 + local_18;
          local_d0 = local_d0 - lVar9;
          uVar8 = local_28 - lVar9;
        }
        local_28 = uVar8;
        uVar7 = *(int *)((long)local_30 + 500) + (int)(local_d0 << 3);
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        local_c0[0] = 0;
        local_c0[1] = 0;
        local_c0[2] = 0;
        local_c0[3] = 0;
        local_c0[4] = 0;
        local_c0[5] = 0;
        local_c0[6] = 0;
        local_c0[7] = 0;
        local_ec = *(uint *)((long)local_30 + 0x23c);
        for (local_e0 = 0; local_e0 < local_28; local_e0 = local_e0 + 1) {
          bVar1 = (byte)(local_e0 - local_d0 >> 0x38);
          uVar10 = local_ec + 1;
          *(byte *)((long)__s + (ulong)local_ec) =
               (bVar1 ^ 0xff) & 0x80 & ((byte)(local_d0 - local_e0 >> 0x38) ^ 0xff) |
               bVar1 & *(byte *)(local_18 + local_e0);
          local_ec = uVar10;
          if (uVar10 == 0x40) {
            uVar10 = (uint)((local_d0 + 7) - local_e0 >> 0x20);
            *(uint *)((long)pvVar2 + 0x238) =
                 *(uint *)((long)pvVar2 + 0x238) | uVar7 & (int)uVar10 >> 0x1f;
            sha256_block_data_order((long)local_30 + 0x1d4,__s,1);
            uVar10 = (int)((uint)((local_e0 - local_d0) + -0x48 >> 0x20) & uVar10) >> 0x1f;
            local_c0[0] = local_c0[0] | *(uint *)((long)local_30 + 0x1d4) & uVar10;
            local_c0[1] = local_c0[1] | *(uint *)((long)local_30 + 0x1d8) & uVar10;
            local_c0[2] = local_c0[2] | *(uint *)((long)local_30 + 0x1dc) & uVar10;
            local_c0[3] = local_c0[3] | *(uint *)((long)local_30 + 0x1e0) & uVar10;
            local_c0[4] = local_c0[4] | *(uint *)((long)local_30 + 0x1e4) & uVar10;
            local_c0[5] = local_c0[5] | *(uint *)((long)local_30 + 0x1e8) & uVar10;
            local_c0[6] = local_c0[6] | *(uint *)((long)local_30 + 0x1ec) & uVar10;
            local_c0[7] = local_c0[7] | *(uint *)((long)local_30 + 0x1f0) & uVar10;
            local_ec = 0;
          }
        }
        for (local_e8 = (ulong)local_ec; local_e8 < 0x40; local_e8 = local_e8 + 1) {
          *(undefined1 *)((long)__s + local_e8) = 0;
          local_e0 = local_e0 + 1;
        }
        if (0x38 < local_ec) {
          uVar10 = (uint)((local_d0 + 8) - local_e0 >> 0x20);
          *(uint *)((long)pvVar2 + 0x238) =
               *(uint *)((long)pvVar2 + 0x238) | uVar7 & (int)uVar10 >> 0x1f;
          sha256_block_data_order((long)local_30 + 0x1d4,__s,1);
          uVar10 = (int)((uint)((local_e0 - local_d0) + -0x49 >> 0x20) & uVar10) >> 0x1f;
          local_c0[0] = local_c0[0] | *(uint *)((long)local_30 + 0x1d4) & uVar10;
          local_c0[1] = local_c0[1] | *(uint *)((long)local_30 + 0x1d8) & uVar10;
          local_c0[2] = local_c0[2] | *(uint *)((long)local_30 + 0x1dc) & uVar10;
          local_c0[3] = local_c0[3] | *(uint *)((long)local_30 + 0x1e0) & uVar10;
          local_c0[4] = local_c0[4] | *(uint *)((long)local_30 + 0x1e4) & uVar10;
          local_c0[5] = local_c0[5] | *(uint *)((long)local_30 + 0x1e8) & uVar10;
          local_c0[6] = local_c0[6] | *(uint *)((long)local_30 + 0x1ec) & uVar10;
          local_c0[7] = local_c0[7] | *(uint *)((long)local_30 + 0x1f0) & uVar10;
          memset(__s,0,0x40);
          local_e0 = local_e0 + 0x40;
        }
        *(uint *)((long)pvVar2 + 0x238) = uVar7;
        sha256_block_data_order((long)local_30 + 0x1d4,__s,1);
        uVar7 = (uint)((long)((local_e0 - local_d0) + -0x49) >> 0x3f);
        local_c0[0] = local_c0[0] | *(uint *)((long)local_30 + 0x1d4) & uVar7;
        local_c0[1] = local_c0[1] | *(uint *)((long)local_30 + 0x1d8) & uVar7;
        local_c0[2] = local_c0[2] | *(uint *)((long)local_30 + 0x1dc) & uVar7;
        local_c0[3] = local_c0[3] | *(uint *)((long)local_30 + 0x1e0) & uVar7;
        local_c0[4] = local_c0[4] | *(uint *)((long)local_30 + 0x1e4) & uVar7;
        local_c0[5] = local_c0[5] | *(uint *)((long)local_30 + 0x1e8) & uVar7;
        local_c0[6] = local_c0[6] | *(uint *)((long)local_30 + 0x1ec) & uVar7;
        local_c0[7] = local_c0[7] | *(uint *)((long)local_30 + 0x1f0) & uVar7;
        local_c0[0] = local_c0[0] >> 0x18 | (local_c0[0] & 0xff0000) >> 8 |
                      (local_c0[0] & 0xff00) << 8 | local_c0[0] << 0x18;
        local_c0[1] = local_c0[1] >> 0x18 | (local_c0[1] & 0xff0000) >> 8 |
                      (local_c0[1] & 0xff00) << 8 | local_c0[1] << 0x18;
        local_c0[2] = local_c0[2] >> 0x18 | (local_c0[2] & 0xff0000) >> 8 |
                      (local_c0[2] & 0xff00) << 8 | local_c0[2] << 0x18;
        local_c0[3] = local_c0[3] >> 0x18 | (local_c0[3] & 0xff0000) >> 8 |
                      (local_c0[3] & 0xff00) << 8 | local_c0[3] << 0x18;
        local_c0[4] = local_c0[4] >> 0x18 | (local_c0[4] & 0xff0000) >> 8 |
                      (local_c0[4] & 0xff00) << 8 | local_c0[4] << 0x18;
        local_c0[5] = local_c0[5] >> 0x18 | (local_c0[5] & 0xff0000) >> 8 |
                      (local_c0[5] & 0xff00) << 8 | local_c0[5] << 0x18;
        local_c0[6] = local_c0[6] >> 0x18 | (local_c0[6] & 0xff0000) >> 8 |
                      (local_c0[6] & 0xff00) << 8 | local_c0[6] << 0x18;
        local_c0[7] = local_c0[7] >> 0x18 | (local_c0[7] & 0xff0000) >> 8 |
                      (local_c0[7] & 0xff00) << 8 | local_c0[7] << 0x18;
        local_28 = local_28 + 0x20;
        memcpy((void *)((long)local_30 + 0x1d4),(void *)((long)local_30 + 0x164),0x70);
        sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        SHA256_Final((uchar *)local_c0,(SHA256_CTX *)((long)local_30 + 0x1d4));
        lVar9 = ((local_d0 + local_18 + (local_28 - local_d0)) - (ulong)uVar4) + -0x21;
        iVar3 = (int)(local_d0 + local_18) - (int)lVar9;
        local_ec = 0;
        local_e8 = 0;
        for (local_e0 = 0; local_e0 < uVar4 + 0x20; local_e0 = local_e0 + 1) {
          bVar1 = *(byte *)(lVar9 + local_e0);
          uVar7 = ((int)local_e0 - iVar3) - 0x20;
          uVar10 = (int)((iVar3 + -1) - (int)local_e0 & uVar7) >> 0x1f;
          local_ec = (bVar1 ^ *(byte *)((long)local_c0 + local_e8)) & uVar10 |
                     (bVar1 ^ uVar6) & ((int)uVar7 >> 0x1f ^ 0xffffffffU) | local_ec;
          local_e8 = (uVar10 & 1) + local_e8;
        }
        return ((int)-local_ec >> 0x1f ^ 0xffffffffU) & uVar5 & 1;
      }
      sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    else {
      if (local_40 == 0xffffffffffffffff) {
        local_40 = local_28;
      }
      else {
        if (local_28 != (local_40 + 0x30 & 0xfffffffffffffff0)) {
          return 0;
        }
        if (0x301 < *(uint *)((long)local_30 + 0x250)) {
          local_48 = 0x10;
        }
      }
      if (((((_DAT_005e9d20 & 0x20000000) == 0) &&
           (((DAT_005e9d1c & 0x10000000) == 0 ||
            ((DAT_005e9d1c & 0x800) == 0 && (OPENSSL_ia32cap_P & 0x40000000) == 0)))) ||
          (local_40 <= local_50 + local_48)) ||
         (local_60 = local_40 - (local_50 + local_48) >> 6, local_60 == 0)) {
        local_50 = 0;
      }
      else {
        sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        aesni_cbc_sha256_enc
                  (local_20,local_18,local_60,local_30,local_10->iv,(long)local_30 + 0x1d4,
                   local_20 + local_48 + local_50);
        uVar8 = local_60 * 0x40;
        local_58 = uVar8 + local_58;
        local_50 = uVar8 + local_50;
        *(int *)((long)local_30 + 0x1f8) = *(int *)((long)local_30 + 0x1f8) + (int)(uVar8 >> 0x1d);
        local_60 = local_60 << 9;
        *(uint *)((long)local_30 + 500) = *(int *)((long)local_30 + 500) + (uint)local_60;
        if (*(uint *)((long)local_30 + 500) < (uint)local_60) {
          *(int *)((long)local_30 + 0x1f8) = *(int *)((long)local_30 + 0x1f8) + 1;
        }
      }
      local_50 = local_48 + local_50;
      sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      if (local_40 == local_28) {
        aesni_cbc_encrypt(local_20 + local_58,local_18 + local_58,local_28 - local_58,local_30,
                          local_10->iv,1);
      }
      else {
        if (local_20 != local_18) {
          memcpy((void *)(local_18 + local_58),(void *)(local_20 + local_58),local_40 - local_58);
        }
        SHA256_Final((uchar *)(local_18 + local_40),(SHA256_CTX *)((long)local_30 + 0x1d4));
        memcpy((void *)((long)local_30 + 0x1d4),(void *)((long)local_30 + 0x164),0x70);
        sha256_update(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        SHA256_Final((uchar *)(local_18 + local_40),(SHA256_CTX *)((long)local_30 + 0x1d4));
        local_40 = local_40 + 0x20;
        local_34 = ((int)local_28 - (int)local_40) + -1;
        for (; local_40 < local_28; local_40 = local_40 + 1) {
          *(char *)(local_18 + local_40) = (char)local_34;
        }
        aesni_cbc_encrypt(local_18 + local_58,local_18 + local_58,local_28 - local_58,local_30,
                          local_10->iv,1);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int aesni_cbc_hmac_sha256_cipher(PROV_CIPHER_CTX *vctx,
                                        unsigned char *out,
                                        const unsigned char *in, size_t len)
{
    PROV_AES_HMAC_SHA_CTX *ctx = (PROV_AES_HMAC_SHA_CTX *)vctx;
    PROV_AES_HMAC_SHA256_CTX *sctx = (PROV_AES_HMAC_SHA256_CTX *)vctx;
    unsigned int l;
    size_t plen = ctx->payload_length;
    size_t iv = 0; /* explicit IV in TLS 1.1 and * later */
    size_t aes_off = 0, blocks;
    size_t sha_off = SHA256_CBLOCK - sctx->md.num;

    ctx->payload_length = NO_PAYLOAD_LENGTH;

    if (len % AES_BLOCK_SIZE)
        return 0;

    if (ctx->base.enc) {
        if (plen == NO_PAYLOAD_LENGTH)
            plen = len;
        else if (len !=
                 ((plen + SHA256_DIGEST_LENGTH +
                   AES_BLOCK_SIZE) & -AES_BLOCK_SIZE))
            return 0;
        else if (ctx->aux.tls_ver >= TLS1_1_VERSION)
            iv = AES_BLOCK_SIZE;

        /*
         * Assembly stitch handles AVX-capable processors, but its
         * performance is not optimal on AMD Jaguar, ~40% worse, for
         * unknown reasons. Incidentally processor in question supports
         * AVX, but not AMD-specific XOP extension, which can be used
         * to identify it and avoid stitch invocation. So that after we
         * establish that current CPU supports AVX, we even see if it's
         * either even XOP-capable Bulldozer-based or GenuineIntel one.
         * But SHAEXT-capable go ahead...
         */
        if (((OPENSSL_ia32cap_P[2] & (1 << 29)) ||         /* SHAEXT? */
             ((OPENSSL_ia32cap_P[1] & (1 << (60 - 32))) && /* AVX? */
              ((OPENSSL_ia32cap_P[1] & (1 << (43 - 32)))   /* XOP? */
               | (OPENSSL_ia32cap_P[0] & (1 << 30))))) &&  /* "Intel CPU"? */
            plen > (sha_off + iv) &&
            (blocks = (plen - (sha_off + iv)) / SHA256_CBLOCK)) {
            sha256_update(&sctx->md, in + iv, sha_off);

            (void)aesni_cbc_sha256_enc(in, out, blocks, &ctx->ks,
                                       ctx->base.iv,
                                       &sctx->md, in + iv + sha_off);
            blocks *= SHA256_CBLOCK;
            aes_off += blocks;
            sha_off += blocks;
            sctx->md.Nh += blocks >> 29;
            sctx->md.Nl += blocks <<= 3;
            if (sctx->md.Nl < (unsigned int)blocks)
                sctx->md.Nh++;
        } else {
            sha_off = 0;
        }
        sha_off += iv;
        sha256_update(&sctx->md, in + sha_off, plen - sha_off);

        if (plen != len) {      /* "TLS" mode of operation */
            if (in != out)
                memcpy(out + aes_off, in + aes_off, plen - aes_off);

            /* calculate HMAC and append it to payload */
            SHA256_Final(out + plen, &sctx->md);
            sctx->md = sctx->tail;
            sha256_update(&sctx->md, out + plen, SHA256_DIGEST_LENGTH);
            SHA256_Final(out + plen, &sctx->md);

            /* pad the payload|hmac */
            plen += SHA256_DIGEST_LENGTH;
            for (l = len - plen - 1; plen < len; plen++)
                out[plen] = l;
            /* encrypt HMAC|padding at once */
            aesni_cbc_encrypt(out + aes_off, out + aes_off, len - aes_off,
                              &ctx->ks, ctx->base.iv, 1);
        } else {
            aesni_cbc_encrypt(in + aes_off, out + aes_off, len - aes_off,
                              &ctx->ks, ctx->base.iv, 1);
        }
    } else {
        union {
            unsigned int u[SHA256_DIGEST_LENGTH / sizeof(unsigned int)];
            unsigned char c[64 + SHA256_DIGEST_LENGTH];
        } mac, *pmac;

        /* arrange cache line alignment */
        pmac = (void *)(((size_t)mac.c + 63) & ((size_t)0 - 64));

        /* decrypt HMAC|padding at once */
        aesni_cbc_encrypt(in, out, len, &ctx->ks,
                          ctx->base.iv, 0);

        if (plen != NO_PAYLOAD_LENGTH) { /* "TLS" mode of operation */
            size_t inp_len, mask, j, i;
            unsigned int res, maxpad, pad, bitlen;
            int ret = 1;
            union {
                unsigned int u[SHA_LBLOCK];
                unsigned char c[SHA256_CBLOCK];
            } *data = (void *)sctx->md.data;

            if ((ctx->aux.tls_aad[plen - 4] << 8 | ctx->aux.tls_aad[plen - 3])
                >= TLS1_1_VERSION)
                iv = AES_BLOCK_SIZE;

            if (len < (iv + SHA256_DIGEST_LENGTH + 1))
                return 0;

            /* omit explicit iv */
            out += iv;
            len -= iv;

            /* figure out payload length */
            pad = out[len - 1];
            maxpad = len - (SHA256_DIGEST_LENGTH + 1);
            maxpad |= (255 - maxpad) >> (sizeof(maxpad) * 8 - 8);
            maxpad &= 255;

            mask = constant_time_ge(maxpad, pad);
            ret &= mask;
            /*
             * If pad is invalid then we will fail the above test but we must
             * continue anyway because we are in constant time code. However,
             * we'll use the maxpad value instead of the supplied pad to make
             * sure we perform well defined pointer arithmetic.
             */
            pad = constant_time_select(mask, pad, maxpad);

            inp_len = len - (SHA256_DIGEST_LENGTH + pad + 1);

            ctx->aux.tls_aad[plen - 2] = inp_len >> 8;
            ctx->aux.tls_aad[plen - 1] = inp_len;

            /* calculate HMAC */
            sctx->md = sctx->head;
            sha256_update(&sctx->md, ctx->aux.tls_aad, plen);

            /* code with lucky-13 fix */
            len -= SHA256_DIGEST_LENGTH; /* amend mac */
            if (len >= (256 + SHA256_CBLOCK)) {
                j = (len - (256 + SHA256_CBLOCK)) & (0 - SHA256_CBLOCK);
                j += SHA256_CBLOCK - sctx->md.num;
                sha256_update(&sctx->md, out, j);
                out += j;
                len -= j;
                inp_len -= j;
            }

            /* but pretend as if we hashed padded payload */
            bitlen = sctx->md.Nl + (inp_len << 3); /* at most 18 bits */
# ifdef BSWAP4
            bitlen = BSWAP4(bitlen);
# else
            mac.c[0] = 0;
            mac.c[1] = (unsigned char)(bitlen >> 16);
            mac.c[2] = (unsigned char)(bitlen >> 8);
            mac.c[3] = (unsigned char)bitlen;
            bitlen = mac.u[0];
# endif /* BSWAP */

            pmac->u[0] = 0;
            pmac->u[1] = 0;
            pmac->u[2] = 0;
            pmac->u[3] = 0;
            pmac->u[4] = 0;
            pmac->u[5] = 0;
            pmac->u[6] = 0;
            pmac->u[7] = 0;

            for (res = sctx->md.num, j = 0; j < len; j++) {
                size_t c = out[j];
                mask = (j - inp_len) >> (sizeof(j) * 8 - 8);
                c &= mask;
                c |= 0x80 & ~mask & ~((inp_len - j) >> (sizeof(j) * 8 - 8));
                data->c[res++] = (unsigned char)c;

                if (res != SHA256_CBLOCK)
                    continue;

                /* j is not incremented yet */
                mask = 0 - ((inp_len + 7 - j) >> (sizeof(j) * 8 - 1));
                data->u[SHA_LBLOCK - 1] |= bitlen & mask;
                sha256_block_data_order(&sctx->md, data, 1);
                mask &= 0 - ((j - inp_len - 72) >> (sizeof(j) * 8 - 1));
                pmac->u[0] |= sctx->md.h[0] & mask;
                pmac->u[1] |= sctx->md.h[1] & mask;
                pmac->u[2] |= sctx->md.h[2] & mask;
                pmac->u[3] |= sctx->md.h[3] & mask;
                pmac->u[4] |= sctx->md.h[4] & mask;
                pmac->u[5] |= sctx->md.h[5] & mask;
                pmac->u[6] |= sctx->md.h[6] & mask;
                pmac->u[7] |= sctx->md.h[7] & mask;
                res = 0;
            }

            for (i = res; i < SHA256_CBLOCK; i++, j++)
                data->c[i] = 0;

            if (res > SHA256_CBLOCK - 8) {
                mask = 0 - ((inp_len + 8 - j) >> (sizeof(j) * 8 - 1));
                data->u[SHA_LBLOCK - 1] |= bitlen & mask;
                sha256_block_data_order(&sctx->md, data, 1);
                mask &= 0 - ((j - inp_len - 73) >> (sizeof(j) * 8 - 1));
                pmac->u[0] |= sctx->md.h[0] & mask;
                pmac->u[1] |= sctx->md.h[1] & mask;
                pmac->u[2] |= sctx->md.h[2] & mask;
                pmac->u[3] |= sctx->md.h[3] & mask;
                pmac->u[4] |= sctx->md.h[4] & mask;
                pmac->u[5] |= sctx->md.h[5] & mask;
                pmac->u[6] |= sctx->md.h[6] & mask;
                pmac->u[7] |= sctx->md.h[7] & mask;

                memset(data, 0, SHA256_CBLOCK);
                j += 64;
            }
            data->u[SHA_LBLOCK - 1] = bitlen;
            sha256_block_data_order(&sctx->md, data, 1);
            mask = 0 - ((j - inp_len - 73) >> (sizeof(j) * 8 - 1));
            pmac->u[0] |= sctx->md.h[0] & mask;
            pmac->u[1] |= sctx->md.h[1] & mask;
            pmac->u[2] |= sctx->md.h[2] & mask;
            pmac->u[3] |= sctx->md.h[3] & mask;
            pmac->u[4] |= sctx->md.h[4] & mask;
            pmac->u[5] |= sctx->md.h[5] & mask;
            pmac->u[6] |= sctx->md.h[6] & mask;
            pmac->u[7] |= sctx->md.h[7] & mask;

# ifdef BSWAP4
            pmac->u[0] = BSWAP4(pmac->u[0]);
            pmac->u[1] = BSWAP4(pmac->u[1]);
            pmac->u[2] = BSWAP4(pmac->u[2]);
            pmac->u[3] = BSWAP4(pmac->u[3]);
            pmac->u[4] = BSWAP4(pmac->u[4]);
            pmac->u[5] = BSWAP4(pmac->u[5]);
            pmac->u[6] = BSWAP4(pmac->u[6]);
            pmac->u[7] = BSWAP4(pmac->u[7]);
# else
            for (i = 0; i < 8; i++) {
                res = pmac->u[i];
                pmac->c[4 * i + 0] = (unsigned char)(res >> 24);
                pmac->c[4 * i + 1] = (unsigned char)(res >> 16);
                pmac->c[4 * i + 2] = (unsigned char)(res >> 8);
                pmac->c[4 * i + 3] = (unsigned char)res;
            }
# endif /* BSWAP */
            len += SHA256_DIGEST_LENGTH;
            sctx->md = sctx->tail;
            sha256_update(&sctx->md, pmac->c, SHA256_DIGEST_LENGTH);
            SHA256_Final(pmac->c, &sctx->md);

            /* verify HMAC */
            out += inp_len;
            len -= inp_len;
            /* code containing lucky-13 fix */
            {
                unsigned char *p =
                    out + len - 1 - maxpad - SHA256_DIGEST_LENGTH;
                size_t off = out - p;
                unsigned int c, cmask;

                for (res = 0, i = 0, j = 0;
                     j < maxpad + SHA256_DIGEST_LENGTH;
                     j++) {
                    c = p[j];
                    cmask =
                        ((int)(j - off - SHA256_DIGEST_LENGTH)) >>
                        (sizeof(int) * 8 - 1);
                    res |= (c ^ pad) & ~cmask; /* ... and padding */
                    cmask &= ((int)(off - 1 - j)) >> (sizeof(int) * 8 - 1);
                    res |= (c ^ pmac->c[i]) & cmask;
                    i += 1 & cmask;
                }

                res = 0 - ((0 - res) >> (sizeof(res) * 8 - 1));
                ret &= (int)~res;
            }
            return ret;
        } else {
            sha256_update(&sctx->md, out, len);
        }
    }

    return 1;
}